

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcondensedcompel.cpp
# Opt level: O2

void __thiscall TPZCondensedCompEl::Assemble(TPZCondensedCompEl *this)

{
  TPZMatRed<double,_TPZFMatrix<double>_> *this_00;
  double dVar1;
  int64_t iVar2;
  double *pdVar3;
  long lVar4;
  long row;
  int64_t j;
  long col;
  TPZElementMatrixT<double> ek;
  TPZElementMatrixT<double> ef;
  TPZElementMatrixT<double> local_86b0;
  TPZElementMatrixT<double> local_4370;
  
  local_86b0.super_TPZElementMatrix._vptr_TPZElementMatrix =
       (_func_int **)(this->fCondensed).fK00.fRef;
  LOCK();
  (((TPZReference *)local_86b0.super_TPZElementMatrix._vptr_TPZElementMatrix)->fCounter).
  super___atomic_base<int>._M_i =
       (((TPZReference *)local_86b0.super_TPZElementMatrix._vptr_TPZElementMatrix)->fCounter).
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  (*(((TPZReference *)local_86b0.super_TPZElementMatrix._vptr_TPZElementMatrix)->fPointer->
    super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xe])
            (((TPZReference *)local_86b0.super_TPZElementMatrix._vptr_TPZElementMatrix)->fPointer,
             this->fNumInternalEqs);
  this_00 = &this->fCondensed;
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<double>_> *)&local_86b0);
  TPZMatRed<double,_TPZFMatrix<double>_>::Redim(this_00,this->fNumTotalEqs,this->fNumInternalEqs);
  TPZMatRed<double,_TPZFMatrix<double>_>::Zero(this_00);
  TPZElementMatrixT<double>::TPZElementMatrixT(&local_86b0);
  TPZElementMatrixT<double>::TPZElementMatrixT(&local_4370);
  (**(code **)(*(long *)this->fReferenceCompEl + 0x108))
            (this->fReferenceCompEl,&local_86b0,&local_4370);
  TPZElementMatrixT<double>::PermuteGather(&local_86b0,&(this->fIndexes).super_TPZVec<long>);
  TPZElementMatrixT<double>::PermuteGather(&local_4370,&(this->fIndexes).super_TPZVec<long>);
  row = 0;
  lVar4 = 0;
  if (0 < local_86b0.fMat.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow)
  {
    lVar4 = local_86b0.fMat.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            fRow;
  }
  for (; row != lVar4; row = row + 1) {
    for (col = 0; local_86b0.fMat.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                  super_TPZBaseMatrix.fRow != col; col = col + 1) {
      pdVar3 = TPZFMatrix<double>::operator()(&local_86b0.fMat.super_TPZFMatrix<double>,row,col);
      dVar1 = *pdVar3;
      pdVar3 = TPZMatrix<double>::operator()(&this_00->super_TPZMatrix<double>,row,col);
      *pdVar3 = dVar1;
    }
  }
  TPZMatRed<double,_TPZFMatrix<double>_>::SetF(this_00,&local_4370.fMat.super_TPZFMatrix<double>);
  iVar2 = (this->fCondensed).fDim1;
  (this->fCondensed).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = iVar2;
  (this->fCondensed).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = iVar2;
  (this->fCondensed).fIsReduced = true;
  TPZElementMatrixT<double>::~TPZElementMatrixT(&local_4370);
  TPZElementMatrixT<double>::~TPZElementMatrixT(&local_86b0);
  return;
}

Assistant:

void TPZCondensedCompEl::Assemble()
{
    fCondensed.K00()->Redim(fNumInternalEqs, fNumInternalEqs);
    fCondensed.Redim(fNumTotalEqs, fNumInternalEqs);

    fCondensed.Zero();
    //TODOCOMPLEX
    TPZElementMatrixT<STATE> ek,ef;
    
    fReferenceCompEl->CalcStiff(ek,ef);
    ek.PermuteGather(fIndexes);
    ef.PermuteGather(fIndexes);

    int64_t dim = ek.fMat.Rows();
    for (int64_t i=0; i<dim ; ++i) {
        for (int64_t j=0; j<dim ; ++j) {
            fCondensed(i,j) = ek.fMat(i,j);
        }
    }
    
    fCondensed.SetF(ef.fMat);
    fCondensed.SetReduced();
}